

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpmux.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int ok;
  Config config;
  Config *in_stack_000000e0;
  char **in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  char **in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  
  iVar1 = InitializeConfig(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                           (Config *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88);
  if (iVar1 == 0) {
    PrintHelp();
  }
  else {
    iVar1 = Process(in_stack_000000e0);
  }
  DeleteConfig((Config *)0x1023ad);
  return (uint)((iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

int main(int argc, const char* argv[]) {
  Config config;
  int ok;

  INIT_WARGV(argc, argv);

  ok = InitializeConfig(argc - 1, argv + 1, &config, GET_WARGV_OR_NULL());
  if (ok) {
    ok = Process(&config);
  } else {
    PrintHelp();
  }
  DeleteConfig(&config);
  FREE_WARGV_AND_RETURN(!ok);
}